

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O0

filepos_t __thiscall
libmatroska::KaxBlockVirtual::UpdateSize(KaxBlockVirtual *this,bool param_1,bool param_2)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte *pbVar2;
  undefined4 extraout_var_01;
  Endian<short,_(libebml::endianess)0> local_26;
  int16 local_22;
  big_int16 b16;
  byte *pbStack_20;
  int16 ActualTimecode;
  binary *cursor;
  bool param_2_local;
  bool param_1_local;
  KaxBlockVirtual *this_local;
  
  if (0x3fff < this->TrackNumber) {
    __assert_fail("TrackNumber < 0x4000",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                  ,0xf5,"virtual filepos_t libmatroska::KaxBlockVirtual::UpdateSize(bool, bool)");
  }
  pbStack_20 = libebml::EbmlBinary::GetBuffer(&this->super_EbmlBinary);
  if (this->TrackNumber < 0x80) {
    iVar1 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
    if (CONCAT44(extraout_var,iVar1) < 4) {
      __assert_fail("GetSize() >= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                    ,0xf9,"virtual filepos_t libmatroska::KaxBlockVirtual::UpdateSize(bool, bool)");
    }
    *pbStack_20 = (byte)this->TrackNumber | 0x80;
    pbStack_20 = pbStack_20 + 1;
  }
  else {
    iVar1 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
    if (CONCAT44(extraout_var_00,iVar1) < 5) {
      __assert_fail("GetSize() >= 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                    ,0xfc,"virtual filepos_t libmatroska::KaxBlockVirtual::UpdateSize(bool, bool)");
    }
    pbVar2 = pbStack_20 + 1;
    *pbStack_20 = (byte)(this->TrackNumber >> 8) | 0x40;
    pbStack_20 = pbStack_20 + 2;
    *pbVar2 = (byte)this->TrackNumber;
  }
  if (this->ParentCluster != (KaxCluster *)0x0) {
    local_22 = KaxCluster::GetBlockLocalTimecode(this->ParentCluster,this->Timecode);
    libebml::Endian<short,_(libebml::endianess)0>::Endian(&local_26,local_22);
    libebml::Endian<short,_(libebml::endianess)0>::Fill(&local_26,pbStack_20);
    pbVar2 = pbStack_20 + 2;
    pbStack_20 = pbStack_20 + 3;
    *pbVar2 = 0;
    iVar1 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
    return CONCAT44(extraout_var_01,iVar1);
  }
  __assert_fail("ParentCluster != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                ,0x101,"virtual filepos_t libmatroska::KaxBlockVirtual::UpdateSize(bool, bool)");
}

Assistant:

filepos_t KaxBlockVirtual::UpdateSize(bool /* bSaveDefault */, bool /* bForceRender */)
{
  assert(TrackNumber < 0x4000);
  binary *cursor = EbmlBinary::GetBuffer();
  // fill data
  if (TrackNumber < 0x80) {
    assert(GetSize() >= 4);
    *cursor++ = TrackNumber | 0x80; // set the first bit to 1
  } else {
    assert(GetSize() >= 5);
    *cursor++ = (TrackNumber >> 8) | 0x40; // set the second bit to 1
    *cursor++ = TrackNumber & 0xFF;
  }

  assert(ParentCluster != NULL);
  int16 ActualTimecode = ParentCluster->GetBlockLocalTimecode(Timecode);
  big_int16 b16(ActualTimecode);
  b16.Fill(cursor);
  cursor += 2;

  *cursor++ = 0; // flags

  return GetSize();
}